

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_tls_write_group(mbedtls_ecp_group *grp,size_t *olen,uchar *buf,size_t blen)

{
  uint16_t uVar1;
  int iVar2;
  mbedtls_ecp_curve_info *pmVar3;
  mbedtls_ecp_group_id mVar4;
  
  mVar4 = MBEDTLS_ECP_DP_SECP521R1;
  pmVar3 = ecp_supported_curves;
  do {
    pmVar3 = pmVar3 + 1;
    if (mVar4 == grp->id) {
      *olen = 3;
      iVar2 = -0x4f00;
      if (2 < blen) {
        *buf = '\x03';
        uVar1 = pmVar3[-1].tls_id;
        buf[1] = (uchar)(uVar1 >> 8);
        buf[2] = (uchar)uVar1;
        iVar2 = 0;
      }
      return iVar2;
    }
    mVar4 = pmVar3->grp_id;
  } while (mVar4 != MBEDTLS_ECP_DP_NONE);
  return -0x4f80;
}

Assistant:

int mbedtls_ecp_tls_write_group( const mbedtls_ecp_group *grp, size_t *olen,
                         unsigned char *buf, size_t blen )
{
    const mbedtls_ecp_curve_info *curve_info;

    if( ( curve_info = mbedtls_ecp_curve_info_from_grp_id( grp->id ) ) == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * We are going to write 3 bytes (see below)
     */
    *olen = 3;
    if( blen < *olen )
        return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );

    /*
     * First byte is curve_type, always named_curve
     */
    *buf++ = MBEDTLS_ECP_TLS_NAMED_CURVE;

    /*
     * Next two bytes are the namedcurve value
     */
    buf[0] = curve_info->tls_id >> 8;
    buf[1] = curve_info->tls_id & 0xFF;

    return( 0 );
}